

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
::dump(key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
       *this,ostream *os)

{
  byte bVar1;
  byte byte;
  ostream *poVar2;
  in_fake_critical_section *this_00;
  ulong local_28;
  size_t i;
  key_prefix_size len;
  ostream *os_local;
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  *this_local;
  
  bVar1 = length(this);
  poVar2 = std::operator<<(os,", prefix(");
  poVar2 = std::operator<<(poVar2,bVar1);
  std::operator<<(poVar2,")");
  if (bVar1 != 0) {
    std::operator<<(os,": 0x");
    for (local_28 = 0; local_28 < bVar1; local_28 = local_28 + 1) {
      this_00 = (in_fake_critical_section *)
                std::array<unodb::in_fake_critical_section<std::byte>,_7UL>::operator[]
                          ((array<unodb::in_fake_critical_section<std::byte>,_7UL> *)this,local_28);
      byte = in_fake_critical_section::operator_cast_to_byte(this_00);
      dump_byte(os,byte);
    }
  }
  return;
}

Assistant:

[[gnu::cold]] UNODB_DETAIL_NOINLINE void dump(std::ostream &os) const {
    const auto len = length();
    os << ", prefix(" << len << ")";
    if (len > 0) {
      os << ": 0x";
      for (std::size_t i = 0; i < len; ++i) dump_byte(os, f.key_prefix[i]);
    }
  }